

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_interpretSend
          (sysbvm_context_t *context,sysbvm_tuple_t receiverType,sysbvm_tuple_t selector,
          size_t argumentCount,sysbvm_tuple_t *receiverAndArguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  
  sVar1 = sysbvm_type_lookupSelector(context,receiverType,selector);
  if (sVar1 != 0) {
    sVar1 = sysbvm_bytecodeInterpreter_functionApply
                      (context,sVar1,argumentCount + 1,receiverAndArguments,0);
    return sVar1;
  }
  if ((context->roots).doesNotUnderstandSelector != selector) {
    sVar1 = sysbvm_type_lookupSelector(context,receiverType,selector);
    if (sVar1 != 0) goto LAB_0013c76c;
  }
  sysbvm_error("Message not understood");
  sVar1 = 0;
LAB_0013c76c:
  sVar2 = sysbvm_array_create(context,argumentCount);
  for (sVar3 = 0; argumentCount != sVar3; sVar3 = sVar3 + 1) {
    if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
      *(sysbvm_tuple_t *)(sVar2 + 0x10 + sVar3 * 8) = receiverAndArguments[sVar3 + 1];
    }
  }
  sVar2 = sysbvm_message_create(context,selector,sVar2,receiverType,0);
  sVar1 = sysbvm_function_apply2(context,sVar1,*receiverAndArguments,sVar2);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_bytecodeInterpreter_interpretSend(sysbvm_context_t *context, sysbvm_tuple_t receiverType, sysbvm_tuple_t selector, size_t argumentCount, sysbvm_tuple_t *receiverAndArguments)
{
    sysbvm_tuple_t method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(method)
        return sysbvm_bytecodeInterpreter_functionApply(context, method, argumentCount + 1, receiverAndArguments, 0);

    // Attempt to send doesNotUnderstand:
    if(selector != context->roots.doesNotUnderstandSelector)
        method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(!method)
        sysbvm_error("Message not understood");

    // Make the message.
    sysbvm_tuple_t arguments = sysbvm_array_create(context, argumentCount);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(arguments, i, receiverAndArguments[1 + i]);

    sysbvm_tuple_t message = sysbvm_message_create(context, selector, arguments, receiverType, SYSBVM_NULL_TUPLE);
    return sysbvm_function_apply2(context, method, receiverAndArguments[0], message);
}